

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_16fac41::HandleUploadCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  cmValue cVar8;
  string *psVar9;
  undefined8 uVar10;
  FILE *__stream;
  unsigned_long uVar11;
  CURL_conflict *data;
  optional<int> oVar12;
  curl_slist *list;
  char *extraout_RDX;
  _Alloc_hider _Var13;
  string *h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__u;
  pointer pbVar14;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view tls_version_00;
  string_view value_00;
  string_view value_01;
  cURLProgressHelper helper;
  string e_13;
  string log;
  string errStr;
  cmFileCommandVectorOfChar chunkDebug;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tls_version;
  cmFileCommandVectorOfChar chunkResponse;
  string netrc_level;
  string url;
  string filename;
  string logVar;
  string netrc_file;
  string userpwd;
  string statusVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  Curl_easy *in_stack_fffffffffffffd68;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  undefined8 local_260;
  undefined8 local_258;
  char *local_250;
  undefined8 local_248;
  byte local_239;
  string local_238;
  long local_218;
  long local_210;
  string local_208;
  string local_1e8;
  ulong local_1c8;
  CURLcode local_1bc;
  vector<char,_std::allocator<char>_> local_1b8;
  undefined1 local_1a0 [32];
  bool local_180;
  vector<char,_std::allocator<char>_> local_178;
  string *local_158;
  char *local_150;
  string local_148;
  long *local_128;
  long local_120;
  long local_118 [2];
  string local_108;
  string local_e8;
  string local_c8;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
    local_288._0_8_ = &local_278;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"UPLOAD must be called with at least three arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._0_8_ != &local_278) {
      operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
    }
    return false;
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  pcVar3 = pbVar2[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
  local_128 = local_118;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_180 = false;
  pcVar4 = status->Makefile;
  local_288._0_8_ = &local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"CMAKE_TLS_VERIFY","");
  bVar5 = cmMakefile::IsOn(pcVar4,(string *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._0_8_ != &local_278) {
    operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
  }
  pcVar4 = status->Makefile;
  local_288._0_8_ = &local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"CMAKE_TLS_CAINFO","");
  cVar8 = cmMakefile::GetDefinition(pcVar4,(string *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._0_8_ != &local_278) {
    operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
  }
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = 0;
  pcVar4 = status->Makefile;
  local_288._0_8_ = &local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"CMAKE_NETRC","");
  psVar9 = cmMakefile::GetSafeDefinition(pcVar4,(string *)local_288);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  pcVar3 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar3,pcVar3 + psVar9->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._0_8_ != &local_278) {
    operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
  }
  pcVar4 = status->Makefile;
  local_288._0_8_ = &local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"CMAKE_NETRC_FILE","");
  psVar9 = cmMakefile::GetSafeDefinition(pcVar4,(string *)local_288);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar3 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,pcVar3 + psVar9->_M_string_length);
  __u = pbVar2 + 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._0_8_ != &local_278) {
    operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
  }
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_239 = bVar5;
  local_158 = cVar8.Value;
  if (__u == (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    local_1c8 = 0;
    local_218 = 0;
    local_210 = 0;
  }
  else {
    local_210 = 0;
    local_218 = 0;
    local_1c8 = 0;
    do {
      iVar6 = std::__cxx11::string::compare((char *)__u);
      if (iVar6 == 0) {
        __u = __u + 1;
        if (__u == (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
          local_288._0_8_ = &local_278;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD missing time for TIMEOUT.","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00437010:
          local_1e8.field_2._M_allocated_capacity = local_278._M_allocated_capacity;
          _Var13._M_p = (pointer)local_288._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._0_8_ == &local_278) goto LAB_0043702c;
          goto LAB_00437024;
        }
        local_210 = atol((__u->_M_dataplus)._M_p);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)__u);
        if (iVar6 == 0) {
          __u = __u + 1;
          if (__u == (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
            local_288._0_8_ = &local_278;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"UPLOAD missing time for INACTIVITY_TIMEOUT.","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00437010;
          }
          local_218 = atol((__u->_M_dataplus)._M_p);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)__u);
          if (iVar6 == 0) {
            __u = __u + 1;
            if (__u == (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) {
              local_288._0_8_ = &local_278;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_288,"UPLOAD missing VAR for LOG.","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_00437010;
            }
            std::__cxx11::string::_M_assign((string *)&local_e8);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)__u);
            if (iVar6 == 0) {
              __u = __u + 1;
              if (__u == (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
                local_288._0_8_ = &local_278;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"UPLOAD missing VAR for STATUS.","");
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_00437010;
              }
              std::__cxx11::string::_M_assign((string *)&local_88);
            }
            else {
              uVar10 = std::__cxx11::string::compare((char *)__u);
              if ((int)uVar10 == 0) {
                local_1c8 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)__u);
                if (iVar6 == 0) {
                  __u = __u + 1;
                  if (__u == (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish) {
                    local_288._0_8_ = &local_278;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_288,"UPLOAD missing value for TLS_VERSION.","");
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    goto LAB_00437010;
                  }
                  std::optional<std::__cxx11::string>::operator=
                            ((optional<std::__cxx11::string> *)local_1a0,__u);
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)__u);
                  if (iVar6 == 0) {
                    if (__u + 1 ==
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
                      local_288._0_8_ = &local_278;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_288,"UPLOAD missing bool value for TLS_VERIFY.","")
                      ;
                      std::__cxx11::string::_M_assign((string *)&status->Error);
                      goto LAB_00437010;
                    }
                    value._M_str = extraout_RDX;
                    value._M_len = (size_t)__u[1]._M_dataplus._M_p;
                    local_239 = cmValue::IsOn((cmValue *)__u[1]._M_string_length,value);
                    __u = __u + 1;
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)__u);
                    if (iVar6 == 0) {
                      local_158 = __u + 1;
                      __u = local_158;
                      if (local_158 ==
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
                        local_288._0_8_ = &local_278;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_288,"UPLOAD missing file value for TLS_CAINFO.",
                                   "");
                        std::__cxx11::string::_M_assign((string *)&status->Error);
                        goto LAB_00437010;
                      }
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)__u);
                      if (iVar6 == 0) {
                        if (__u + 1 ==
                            (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish) {
                          local_288._0_8_ = &local_278;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_288,"UPLOAD missing file value for NETRC_FILE."
                                     ,"");
                          std::__cxx11::string::_M_assign((string *)&status->Error);
                          goto LAB_00437010;
                        }
                        std::__cxx11::string::_M_assign((string *)&local_c8);
                        __u = __u + 1;
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)__u);
                        if (iVar6 == 0) {
                          if (__u + 1 ==
                              (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish) {
                            local_288._0_8_ = &local_278;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_288,"UPLOAD missing level value for NETRC.",
                                       "");
                            std::__cxx11::string::_M_assign((string *)&status->Error);
                            goto LAB_00437010;
                          }
                          std::__cxx11::string::_M_assign((string *)&local_148);
                          __u = __u + 1;
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare((char *)__u);
                          if (iVar6 == 0) {
                            if (__u + 1 ==
                                (args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish) {
                              local_288._0_8_ = &local_278;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_288,"UPLOAD missing string for USERPWD.",""
                                        );
                              std::__cxx11::string::_M_assign((string *)&status->Error);
                              goto LAB_00437010;
                            }
                            std::__cxx11::string::_M_assign((string *)&local_a8);
                            __u = __u + 1;
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare((char *)__u);
                            if (iVar6 == 0) {
                              __u = __u + 1;
                              if (__u == (args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish) {
                                local_288._0_8_ = &local_278;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_288,
                                           "UPLOAD missing string for HTTPHEADER.","");
                                std::__cxx11::string::_M_assign((string *)&status->Error);
                                goto LAB_00437010;
                              }
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&local_68,__u);
                            }
                            else {
                              cmStrCat<char_const(&)[22],std::__cxx11::string_const&>
                                        ((string *)local_288,(char (*) [22])"Unexpected argument: ",
                                         __u);
                              cmMakefile::IssueMessage
                                        (status->Makefile,AUTHOR_WARNING,(string *)local_288);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_288._0_8_ != &local_278) {
                                operator_delete((void *)local_288._0_8_,
                                                local_278._M_allocated_capacity + 1);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      __u = __u + 1;
    } while (__u != (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_180 == false) {
    pcVar4 = status->Makefile;
    local_288._0_8_ = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"CMAKE_TLS_VERSION","");
    cVar8 = cmMakefile::GetDefinition(pcVar4,(string *)local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._0_8_ != &local_278) {
      operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
    }
    if (cVar8.Value != (string *)0x0) {
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)local_1a0,cVar8.Value);
    }
  }
  if (local_180 == false) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"CMAKE_TLS_VERSION","");
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_288,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((bool)(byte)local_268 == true) {
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1a0,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_288);
    }
    if ((((byte)local_268 & 1) != 0) &&
       (local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((ulong)local_268 & 0xffffffffffffff00),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_288._0_8_ != &local_278)) {
      operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
    }
  }
  __stream = (FILE *)cmsys::SystemTools::Fopen(&local_108,"rb");
  if (__stream == (FILE *)0x0) {
    local_288._0_8_ = &DAT_00000019;
    local_288._8_8_ = "UPLOAD cannot open file \'";
    local_278._M_allocated_capacity = 0;
    local_278._8_8_ = local_108._M_string_length;
    local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p;
    local_260 = 0;
    local_258 = 0xe;
    local_250 = "\' for reading.";
    local_248 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_288;
    cmCatViews(&local_1e8,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    _Var13._M_p = local_1e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
LAB_00437024:
      operator_delete(_Var13._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    uVar11 = cmsys::SystemTools::FileLength(&local_108);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_128,local_120 + (long)local_128);
    cmCurlFixFileURL((string *)local_288,&local_50);
    std::__cxx11::string::operator=((string *)&local_128,(string *)local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._0_8_ != &local_278) {
      operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    curl_global_init(3);
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      CVar7 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      if (CVar7 == CURLE_OK) {
        CVar7 = curl_easy_setopt(data,CURLOPT_UPLOAD,1);
        if (CVar7 != CURLE_OK) {
          local_288._0_8_ = &local_278;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set upload flag: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_288);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00436e79;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_URL,local_128);
        if (CVar7 != CURLE_OK) {
          local_288._0_8_ = &local_278;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set url: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_288);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00436e79;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmWriteToMemoryCallback);
        if (CVar7 != CURLE_OK) {
          local_288._0_8_ = &local_278;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set write function: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_288);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00436e79;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmFileCommandCurlDebugCallback);
        if (CVar7 != CURLE_OK) {
          local_288._0_8_ = &local_278;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set debug function: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_288);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00436e79;
        }
        if (local_180 == true) {
          tls_version_00._M_str = (char *)local_1a0._0_8_;
          tls_version_00._M_len = local_1a0._8_8_;
          oVar12 = cmCurlParseTLSVersion(tls_version_00);
          if (((ulong)oVar12.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
            cmStrCat<char_const(&)[38],std::__cxx11::string&>
                      ((string *)local_288,(char (*) [38])"UPLOAD given unknown TLS/SSL version ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a0);
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          else {
            CVar7 = curl_easy_setopt(data,CURLOPT_SSLVERSION,
                                     (ulong)oVar12.super__Optional_base<int,_true,_true>._M_payload.
                                            super__Optional_payload_base<int> & 0xffffffff);
            if (CVar7 == CURLE_OK) goto LAB_004371e4;
            cmStrCat<char_const(&)[35],std::__cxx11::string&,char_const(&)[3]>
                      ((string *)local_288,(char (*) [35])"UPLOAD cannot set TLS/SSL version ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a0,(char (*) [3])0x9442d0);
            curl_easy_strerror(CVar7);
            std::__cxx11::string::append(local_288);
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          goto LAB_00436e79;
        }
LAB_004371e4:
        if ((local_239 & 1) == 0) {
          CVar7 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
          if (CVar7 == CURLE_OK) goto LAB_004372b8;
          local_288._0_8_ = &local_278;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set TLS/SSL Verify off: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_288);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00436e79;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,1);
        if (CVar7 != CURLE_OK) {
          local_288._0_8_ = &local_278;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set TLS/SSL Verify on: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_288);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00436e79;
        }
LAB_004372b8:
        psVar9 = local_158;
        if (local_158 == (string *)0x0) {
          psVar9 = &cmValue::Empty_abi_cxx11_;
        }
        cmCurlSetCAInfo(&local_1e8,data,psVar9);
        if (local_1e8._M_string_length == 0) {
          local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          CVar7 = curl_easy_setopt(data,CURLOPT_WRITEDATA);
          if (CVar7 == CURLE_OK) {
            CVar7 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&local_1b8);
            if (CVar7 != CURLE_OK) {
              local_288._0_8_ = &local_278;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_288,"UPLOAD cannot set debug data: ","");
              curl_easy_strerror(CVar7);
              std::__cxx11::string::append(local_288);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_0043745d;
            }
            CVar7 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
            if (CVar7 != CURLE_OK) {
              local_288._0_8_ = &local_278;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_288,"UPLOAD cannot set follow-redirect option: ","");
              curl_easy_strerror(CVar7);
              std::__cxx11::string::append(local_288);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_0043745d;
            }
            if ((local_e8._M_string_length != 0) &&
               (CVar7 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar7 != CURLE_OK)) {
              local_288._0_8_ = &local_278;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_288,"UPLOAD cannot set verbose: ","");
              curl_easy_strerror(CVar7);
              std::__cxx11::string::append(local_288);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_0043745d;
            }
            if ((0 < local_210) &&
               (CVar7 = curl_easy_setopt(data,CURLOPT_TIMEOUT,local_210), CVar7 != CURLE_OK)) {
              local_288._0_8_ = &local_278;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_288,"UPLOAD cannot set timeout: ","");
              curl_easy_strerror(CVar7);
              std::__cxx11::string::append(local_288);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_0043745d;
            }
            if (0 < local_218) {
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,local_218);
            }
            local_288._8_8_ = status->Makefile;
            local_288._0_8_ = (pointer)0xffffffffffffffff;
            local_278._M_allocated_capacity = (size_type)&local_268;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"upload","");
            if ((local_1c8 & 1) == 0) {
LAB_0043777d:
              CVar7 = curl_easy_setopt(data,CURLOPT_READDATA,__stream);
              if (CVar7 != CURLE_OK) {
                local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_238,"UPLOAD cannot set input file: ","");
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append((char *)&local_238);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_00437843;
              }
              CVar7 = curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar11);
              if (CVar7 != CURLE_OK) {
                local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_238,"UPLOAD cannot set input file size: ","");
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append((char *)&local_238);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_00437843;
              }
              if ((local_a0 != 0) &&
                 (CVar7 = curl_easy_setopt(data,CURLOPT_USERPWD,local_a8), CVar7 != CURLE_OK)) {
                local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_238,"UPLOAD cannot set user password: ","");
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append((char *)&local_238);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_00437843;
              }
              cmsys::SystemTools::UpperCase(&local_238,&local_148);
              std::__cxx11::string::operator=((string *)&local_148,(string *)&local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              cmCurlSetNETRCOption(&local_238,data,&local_148,&local_c8);
              pbVar2 = local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              bVar5 = local_238._M_string_length == 0;
              if (bVar5) {
                list = (curl_slist *)0x0;
                for (pbVar14 = local_68.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar2;
                    pbVar14 = pbVar14 + 1) {
                  list = curl_slist_append(list,(pbVar14->_M_dataplus)._M_p);
                }
                curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
                CVar7 = curl_easy_perform(data);
                curl_slist_free_all(list);
                curl_easy_cleanup(in_stack_fffffffffffffd68);
                if (local_88._M_string_length != 0) {
                  pcVar4 = status->Makefile;
                  local_1bc = CVar7;
                  local_150 = curl_easy_strerror(CVar7);
                  cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>
                            (&local_208,(int *)&local_1bc,(char (*) [3])0x91d9cd,&local_150,
                             (char (*) [2])0x9565ac);
                  value_00._M_str = local_208._M_dataplus._M_p;
                  value_00._M_len = local_208._M_string_length;
                  cmMakefile::AddDefinition(pcVar4,&local_88,value_00);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != &local_208.field_2) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                             local_208.field_2._M_local_buf[0]) + 1);
                  }
                }
                curl_global_cleanup();
                fclose(__stream);
                if (local_e8._M_string_length != 0) {
                  paVar1 = &local_208.field_2;
                  local_208._M_string_length = 0;
                  local_208.field_2._M_local_buf[0] = '\0';
                  local_208._M_dataplus._M_p = (pointer)paVar1;
                  if (local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    local_150 = (char *)((ulong)local_150 & 0xffffffffffffff00);
                    std::vector<char,_std::allocator<char>_>::emplace_back<char>
                              (&local_178,(char *)&local_150);
                    std::__cxx11::string::append((char *)&local_208);
                    std::__cxx11::string::append((char *)&local_208);
                    std::__cxx11::string::append((char *)&local_208);
                  }
                  if (local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    local_150 = (char *)((ulong)local_150 & 0xffffffffffffff00);
                    std::vector<char,_std::allocator<char>_>::emplace_back<char>
                              (&local_1b8,(char *)&local_150);
                    std::__cxx11::string::append((char *)&local_208);
                    std::__cxx11::string::append((char *)&local_208);
                    std::__cxx11::string::append((char *)&local_208);
                  }
                  value_01._M_str = local_208._M_dataplus._M_p;
                  value_01._M_len = local_208._M_string_length;
                  cmMakefile::AddDefinition(status->Makefile,&local_e8,value_01);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != paVar1) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                             local_208.field_2._M_local_buf[0]) + 1);
                  }
                }
                data = (CURL_conflict *)0x0;
              }
              else {
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              CVar7 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
              if (CVar7 == CURLE_OK) {
                CVar7 = curl_easy_setopt(data,CURLOPT_XFERINFOFUNCTION,cmFileUploadProgressCallback)
                ;
                if (CVar7 == CURLE_OK) {
                  CVar7 = curl_easy_setopt(data,CURLOPT_XFERINFODATA,local_288);
                  if (CVar7 == CURLE_OK) goto LAB_0043777d;
                  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_238,"UPLOAD cannot set progress data: ","");
                  curl_easy_strerror(CVar7);
                  std::__cxx11::string::append((char *)&local_238);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                }
                else {
                  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_238,"UPLOAD cannot set progress function: ","");
                  curl_easy_strerror(CVar7);
                  std::__cxx11::string::append((char *)&local_238);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                }
              }
              else {
                local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_238,"UPLOAD cannot set noprogress value: ","");
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append((char *)&local_238);
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
LAB_00437843:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              bVar5 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)local_278._M_allocated_capacity != &local_268) {
              operator_delete((void *)local_278._M_allocated_capacity,
                              (ulong)(local_268->_M_local_buf + 1));
            }
          }
          else {
            local_288._0_8_ = &local_278;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"UPLOAD cannot set write data: ","");
            curl_easy_strerror(CVar7);
            std::__cxx11::string::append(local_288);
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0043745d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._0_8_ != &local_278) {
              operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
            }
            bVar5 = false;
          }
          if (local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)&status->Error);
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_288._0_8_ = &local_278;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"UPLOAD cannot set fail on error flag: ","");
        curl_easy_strerror(CVar7);
        std::__cxx11::string::append(local_288);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00436e79:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._0_8_ != &local_278) {
          operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
        }
        bVar5 = false;
      }
      cURLEasyGuard::~cURLEasyGuard((cURLEasyGuard *)data);
      goto LAB_0043702e;
    }
    local_288._0_8_ = &local_278;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"UPLOAD error initializing curl.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._0_8_ != &local_278) {
      operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
    }
    fclose(__stream);
  }
LAB_0043702c:
  bVar5 = false;
LAB_0043702e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  if ((local_180 == true) && (local_180 = false, (undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10))
  {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  if (local_128 != local_118) {
    operator_delete(local_128,local_118[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool HandleUploadCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  if (args.size() < 3) {
    status.SetError("UPLOAD must be called with at least three arguments.");
    return false;
  }
  auto i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;
  cm::optional<std::string> tls_version;
  bool tls_verify = status.GetMakefile().IsOn("CMAKE_TLS_VERIFY");
  cmValue cainfo = status.GetMakefile().GetDefinition("CMAKE_TLS_CAINFO");
  std::string userpwd;
  std::string netrc_level =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC_FILE");

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "TLS_VERSION") {
      ++i;
      if (i != args.end()) {
        tls_version = *i;
      } else {
        status.SetError("UPLOAD missing value for TLS_VERSION.");
        return false;
      }
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmIsOn(*i);
      } else {
        status.SetError("UPLOAD missing bool value for TLS_VERIFY.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = cmValue(*i);
      } else {
        status.SetError("UPLOAD missing file value for TLS_CAINFO.");
        return false;
      }
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        status.SetError("UPLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        status.SetError("UPLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = cmStrCat("Unexpected argument: ", *i);
      status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    ++i;
  }

  if (!tls_version) {
    if (cmValue v = status.GetMakefile().GetDefinition("CMAKE_TLS_VERSION")) {
      tls_version = *v;
    }
  }
  if (!tls_version) {
    if (cm::optional<std::string> v =
          cmSystemTools::GetEnvVar("CMAKE_TLS_VERSION")) {
      tls_version = std::move(v);
    }
  }

  // Open file for reading:
  //
  FILE* fin = cmsys::SystemTools::Fopen(filename, "rb");
  if (!fin) {
    std::string errStr =
      cmStrCat("UPLOAD cannot open file '", filename, "' for reading.");
    status.SetError(errStr);
    return false;
  }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

  url = cmCurlFixFileURL(url);

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    status.SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
  }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res =
    ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  if (tls_version) {
    if (cm::optional<int> v = cmCurlParseTLSVersion(*tls_version)) {
      res = ::curl_easy_setopt(curl, CURLOPT_SSLVERSION, *v);
      check_curl_result(
        res,
        cmStrCat("UPLOAD cannot set TLS/SSL version ", *tls_version, ": "));
    } else {
      status.SetError(
        cmStrCat("UPLOAD given unknown TLS/SSL version ", *tls_version));
      return false;
    }
  }

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify off: ");
  }

  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    status.SetError(cainfo_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "UPLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(&status.GetMakefile(), "upload");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CM_CURLOPT_XFERINFOFUNCTION,
                             cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
  }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res =
    ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "UPLOAD cannot set user password: ");
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    status.SetError(netrc_option_err);
    return false;
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    status.GetMakefile().AddDefinition(
      statusVar,
      cmStrCat(static_cast<int>(res), ";\"", ::curl_easy_strerror(res), "\""));
  }

  ::curl_global_cleanup();

  fclose(fin);
  fin = nullptr;

  if (!logVar.empty()) {
    std::string log;

    if (!chunkResponse.empty()) {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += chunkResponse.data();
      log += "\n";
    }

    if (!chunkDebug.empty()) {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += chunkDebug.data();
      log += "\n";
    }

    status.GetMakefile().AddDefinition(logVar, log);
  }

  return true;
#else
  status.SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}